

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcurrentQueue.h
# Opt level: O0

bool moodycamel::details::circular_less_than<unsigned_long>(unsigned_long a,unsigned_long b)

{
  unsigned_long b_local;
  unsigned_long a_local;
  
  return 0x8000000000000000 < a - b;
}

Assistant:

static inline bool circular_less_than(T a, T b)
    {
#ifdef _MSC_VER
#pragma warning(push)
#pragma warning(disable: 4554)
#endif
        static_assert(std::is_integral<T>::value && !std::numeric_limits<T>::is_signed, "circular_less_than is intended to be used only with unsigned integer types");
        return static_cast<T>(a - b) > static_cast<T>(static_cast<T>(1) << static_cast<T>(sizeof(T) * CHAR_BIT - 1));
#ifdef _MSC_VER
#pragma warning(pop)
#endif
    }